

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftstroke.c
# Opt level: O0

FT_Error FT_Stroker_New(FT_Library library,FT_Stroker *astroker)

{
  FT_Memory memory_00;
  FT_Stroker pFVar1;
  FT_Stroker stroker;
  FT_Memory memory;
  FT_Stroker *ppFStack_20;
  FT_Error error;
  FT_Stroker *astroker_local;
  FT_Library library_local;
  
  if (library == (FT_Library)0x0) {
    library_local._4_4_ = 0x21;
  }
  else if (astroker == (FT_Stroker *)0x0) {
    library_local._4_4_ = 6;
  }
  else {
    memory_00 = library->memory;
    ppFStack_20 = astroker;
    astroker_local = (FT_Stroker *)library;
    pFVar1 = (FT_Stroker)ft_mem_alloc(memory_00,0xd8,(FT_Error *)((long)&memory + 4));
    if (memory._4_4_ == 0) {
      pFVar1->library = (FT_Library)astroker_local;
      ft_stroke_border_init(pFVar1->borders,memory_00);
      ft_stroke_border_init(pFVar1->borders + 1,memory_00);
    }
    *ppFStack_20 = pFVar1;
    library_local._4_4_ = memory._4_4_;
  }
  return library_local._4_4_;
}

Assistant:

FT_EXPORT_DEF( FT_Error )
  FT_Stroker_New( FT_Library   library,
                  FT_Stroker  *astroker )
  {
    FT_Error    error;           /* assigned in FT_NEW */
    FT_Memory   memory;
    FT_Stroker  stroker = NULL;


    if ( !library )
      return FT_THROW( Invalid_Library_Handle );

    if ( !astroker )
      return FT_THROW( Invalid_Argument );

    memory = library->memory;

    if ( !FT_NEW( stroker ) )
    {
      stroker->library = library;

      ft_stroke_border_init( &stroker->borders[0], memory );
      ft_stroke_border_init( &stroker->borders[1], memory );
    }

    *astroker = stroker;

    return error;
  }